

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator<
               (Intrusive_list_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
                *c1,Intrusive_list_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  Column_support *pCVar5;
  bool bVar6;
  
  if (c1 == c2) {
    return false;
  }
  pCVar5 = &c2->column_;
  plVar3 = (node_ptr)pCVar5;
  plVar4 = (node_ptr)&c1->column_;
  do {
    plVar4 = (((type *)&plVar4->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if ((plVar4 == (node_ptr)&c1->column_) || (plVar3 == (node_ptr)pCVar5)) {
      return plVar3 != (node_ptr)pCVar5;
    }
    bVar6 = *(uint *)&plVar4[1].next_ < *(uint *)&plVar3[1].next_;
  } while ((*(uint *)&plVar4[1].next_ == *(uint *)&plVar3[1].next_) &&
          (uVar1 = *(uint *)((long)&plVar3[-1].prev_ + 4),
          uVar2 = *(uint *)((long)&plVar4[-1].prev_ + 4), bVar6 = uVar2 < uVar1, uVar2 == uVar1));
  return bVar6;
}

Assistant:

bool operator<(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return false;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ < c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index()) return it1->get_row_index() < it2->get_row_index();
        if (it1->get_element() != it2->get_element()) return it1->get_element() < it2->get_element();
        ++it1;
        ++it2;
      }
      return it2 != c2.column_.end();
    }
  }